

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_compr.c
# Opt level: O2

void beltCompr(u32 *h,u32 *X,void *stack)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *(ulong *)(h + 4);
  uVar2 = *(ulong *)h;
  *(ulong *)stack = uVar1 ^ uVar2;
  uVar3 = *(ulong *)(h + 6);
  uVar4 = *(ulong *)(h + 2);
  *(ulong *)((long)stack + 8) = uVar3 ^ uVar4;
  *(ulong *)((long)stack + 0x10) = uVar1 ^ uVar2;
  *(ulong *)((long)stack + 0x18) = uVar3 ^ uVar4;
  beltBlockEncr2((u32 *)stack,X);
  *(ulong *)stack = *(ulong *)((long)stack + 0x10) ^ *stack;
  *(ulong *)((long)stack + 8) = *(ulong *)((long)stack + 0x18) ^ *(ulong *)((long)stack + 8);
  *(undefined8 *)((long)stack + 0x20) = *(undefined8 *)h;
  *(undefined8 *)((long)stack + 0x28) = *(undefined8 *)(h + 2);
  *(undefined8 *)((long)stack + 0x10) = *(undefined8 *)(h + 4);
  *(undefined8 *)((long)stack + 0x18) = *(undefined8 *)(h + 6);
  *(undefined8 *)h = *(undefined8 *)X;
  *(undefined8 *)(h + 2) = *(undefined8 *)(X + 2);
  beltBlockEncr2(h,(u32 *)stack);
  *(ulong *)h = *(ulong *)h ^ *(ulong *)X;
  *(ulong *)(h + 2) = *(ulong *)(h + 2) ^ *(ulong *)(X + 2);
  *(uint *)((long)stack + 0x10) = *stack ^ 0xffffffff;
  *(uint *)((long)stack + 0x14) = *(uint *)((long)stack + 4) ^ 0xffffffff;
  *(uint *)((long)stack + 0x18) = *(uint *)((long)stack + 8) ^ 0xffffffff;
  *(uint *)((long)stack + 0x1c) = *(uint *)((long)stack + 0xc) ^ 0xffffffff;
  *(undefined8 *)(h + 4) = *(undefined8 *)(X + 4);
  *(undefined8 *)(h + 6) = *(undefined8 *)(X + 6);
  beltBlockEncr2(h + 4,(u32 *)((long)stack + 0x10));
  *(ulong *)(h + 4) = *(ulong *)(h + 4) ^ *(ulong *)(X + 4);
  *(ulong *)(h + 6) = *(ulong *)(h + 6) ^ *(ulong *)(X + 6);
  return;
}

Assistant:

void beltCompr(u32 h[8], const u32 X[8], void* stack)
{
	// [12]buf = [4]buf0 || [4]buf1 || [4]buf2
	u32* buf = (u32*)stack;
	// буферы не пересекаются?
	ASSERT(memIsDisjoint3(h, 32, X, 32, buf, 48));
	// buf0, buf1 <- h0 + h1
	beltBlockXor(buf, h, h + 4);
	beltBlockCopy(buf + 4, buf);
	// buf0 <- beltBlock(buf0, X) + buf1
	beltBlockEncr2(buf, X);
	beltBlockXor2(buf, buf + 4);
	// buf2 <- h0
	beltBlockCopy(buf + 8, h);
	// buf1 <- h1 [buf01 == K1]
	beltBlockCopy(buf + 4, h + 4);
	// h0 <- beltBlock(X0, buf01) + X0
	beltBlockCopy(h, X);
	beltBlockEncr2(h, buf);
	beltBlockXor2(h, X);
	// buf1 <- ~buf0 [buf12 == K2]
	beltBlockNeg(buf + 4, buf);
	// h1 <- beltBlock(X1, buf12) + X1
	beltBlockCopy(h + 4, X + 4);
	beltBlockEncr2(h + 4, buf + 4);
	beltBlockXor2(h + 4, X + 4);
}